

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmDivl<(moira::Instr)154,(moira::Mode)11,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  Syntax SVar2;
  char *pcVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  Dn dn;
  char *pcVar9;
  uint uVar10;
  Dn dn_00;
  bool bVar11;
  Ea<(moira::Mode)11,_4> src;
  u32 local_44;
  ushort local_40;
  uint local_3c;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar5 = (*this->_vptr_Moira[6])();
  uVar10 = uVar5 & 0xffff;
  local_40 = op & 7;
  local_44 = *addr;
  *addr = local_44 + 2;
  iVar6 = (*this->_vptr_Moira[6])(this);
  *addr = *addr + 2;
  uVar7 = (*this->_vptr_Moira[6])(this);
  local_3c = uVar7 & 0xffff | iVar6 << 0x10;
  bVar11 = (str->style->syntax & ~MOIRA_MIT) == GNU;
  pcVar9 = ":";
  if (bVar11) {
    pcVar9 = ",";
  }
  if ((uVar5 & 0x83f8) != 0 && bVar11) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)154,(moira::Mode)11,4>(this,str,addr,op);
    return;
  }
  cVar4 = 'd';
  lVar8 = 0;
  if ((uVar10 >> 0xb & 1) == 0) {
    do {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = cVar4;
      cVar4 = "divu"[lVar8 + 1];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
  }
  else {
    do {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = cVar4;
      cVar4 = "fddivs"[lVar8 + 3];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
  }
  dn_00.raw = uVar10 >> 0xc & 7;
  dn.raw = uVar5 & 7;
  if ((uVar10 >> 10 & 1) == 0) {
    if ((dn_00.raw == dn.raw) && (str->style->syntax == MUSASHI)) {
      cVar4 = '.';
      lVar8 = 0;
      do {
        pcVar9 = str->ptr;
        str->ptr = pcVar9 + 1;
        *pcVar9 = cVar4;
        cVar4 = "$%x.l"[lVar8 + 4];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 2);
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar9 = str->ptr;
        str->ptr = pcVar9 + 1;
        *pcVar9 = ' ';
      }
      else {
        iVar6 = (str->tab).raw;
        do {
          pcVar9 = str->ptr;
          str->ptr = pcVar9 + 1;
          *pcVar9 = ' ';
        } while (str->ptr < str->base + iVar6);
      }
      StrWriter::operator<<(str,(Ea<(moira::Mode)11,_4> *)&local_44);
      pcVar9 = str->ptr;
      str->ptr = pcVar9 + 1;
      *pcVar9 = ',';
      SVar2 = str->style->syntax;
      dn_00.raw = dn.raw;
      if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
        pcVar9 = str->ptr;
        str->ptr = pcVar9 + 1;
        *pcVar9 = ' ';
      }
    }
    else {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = 'l';
      if (str->style->syntax - MOIRA_MIT < 3) {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = 'l';
      }
      else {
        cVar4 = '.';
        lVar8 = 0;
        do {
          pcVar3 = str->ptr;
          str->ptr = pcVar3 + 1;
          *pcVar3 = cVar4;
          cVar4 = "$%x.l"[lVar8 + 4];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 2);
      }
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = ' ';
      }
      else {
        iVar6 = (str->tab).raw;
        do {
          pcVar3 = str->ptr;
          str->ptr = pcVar3 + 1;
          *pcVar3 = ' ';
        } while (str->ptr < str->base + iVar6);
      }
      StrWriter::operator<<(str,(Ea<(moira::Mode)11,_4> *)&local_44);
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = ',';
      SVar2 = str->style->syntax;
      if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = ' ';
      }
      StrWriter::operator<<(str,dn);
      cVar4 = *pcVar9;
      while (cVar4 != '\0') {
        pcVar9 = pcVar9 + 1;
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = cVar4;
        cVar4 = *pcVar9;
      }
    }
  }
  else {
    if (str->style->syntax - MOIRA_MIT < 3) {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = 'l';
    }
    else {
      cVar4 = '.';
      lVar8 = 0;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = cVar4;
        cVar4 = "$%x.l"[lVar8 + 4];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 2);
    }
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = ' ';
    }
    else {
      iVar6 = (str->tab).raw;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = ' ';
      } while (str->ptr < str->base + iVar6);
    }
    StrWriter::operator<<(str,(Ea<(moira::Mode)11,_4> *)&local_44);
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = ',';
    SVar2 = str->style->syntax;
    if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = ' ';
    }
    StrWriter::operator<<(str,dn);
    cVar4 = *pcVar9;
    while (cVar4 != '\0') {
      pcVar9 = pcVar9 + 1;
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = cVar4;
      cVar4 = *pcVar9;
    }
  }
  StrWriter::operator<<(str,dn_00);
  if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
    cVar4 = ';';
    lVar8 = 1;
    do {
      pcVar9 = str->ptr;
      str->ptr = pcVar9 + 1;
      *pcVar9 = cVar4;
      cVar4 = "trap%-2s  ; (2+)"[lVar8 + 10];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 7);
  }
  return;
}

Assistant:

void
Moira::dasmDivl(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word> (addr);
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dl  = Dn       ( _xxx____________(ext)      );
    auto dh  = Dn       ( _____________xxx(ext)      );

    auto fill = str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT ? "," : ":";

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            // Catch illegal extension words
            if (!isValidExt(I, M, op, ext)) {

                addr = old;
                dasmIllegal<I, M, S>(str, addr, op);
                return;
            }
            [[fallthrough]];

        default:

            (ext & 1 << 11) ? str << Ins<Instr::DIVS>{} : str << Ins<Instr::DIVU>{};

            if (ext & 1 << 10) {

                // DIVS.L <ea>,Dr:Dq    (64-bit dividend)
                str << Sz<S>{} << str.tab << src << Sep{} << dh << fill << dl;

            } else {

                // DIVSL.L <ea>,Dr:Dq   (32-bit dividend)
                if (dl.raw == dh.raw && str.style.syntax == Syntax::MUSASHI) {
                    str << Sz<S>{} << str.tab << src << Sep{} << dh;
                } else {
                    str << "l" << Sz<S>{} << str.tab << src << Sep{} << dh << fill << dl;

                }
            }
            str << Av<I, M, S>{};
    }
}